

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequencer.cpp
# Opt level: O1

void __thiscall egc::Sequencer::DCA(Sequencer *this,unsigned_short instruction)

{
  long lVar1;
  long lVar2;
  unsigned_short word;
  unsigned_short word_00;
  ostream *poVar3;
  ushort address;
  
  address = instruction & 0x3ff;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DCA",3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
  *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::ostream::write + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 0x40;
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  lVar1 = *(long *)poVar3;
  lVar2 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar3 + lVar2 + 0x18) = *(uint *)(poVar3 + lVar2 + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  word = Memory::Read((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr,address,0);
  word_00 = Memory::Read((this->m_Memory).
                         super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         address - 1,0);
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                address,word);
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                address - 1,word_00);
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                1,word);
  Memory::Write((this->m_Memory).super___shared_ptr<egc::Memory,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                0,word_00);
  return;
}

Assistant:

void egc::Sequencer::DCA (unsigned short instruction)
{
    unsigned short k = (instruction & 001777u) - 000001u;

    std::cout << "DCA" << " " << std::oct << k << std::dec << std::endl;

    auto mkLow = m_Memory->Read(k + 00001u);
    auto mkHigh = m_Memory->Read(k);

    m_Memory->Write(k + 00001u, mkLow);
    m_Memory->Write(k, mkHigh);
    m_Memory->Write(00001u, mkLow);
    m_Memory->Write(00000u, mkHigh);
}